

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O3

AggregateFunction * duckdb::KahanSumFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType aLStack_38 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  duckdb::LogicalType::LogicalType(aLStack_38,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::KahanSumState,double,double,duckdb::DoubleSumOperation<duckdb::KahanAdd>,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,aLStack_38,(LogicalType *)0x0,
             in_R8B);
  duckdb::LogicalType::~LogicalType(aLStack_38);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction KahanSumFun::GetFunction() {
	return AggregateFunction::UnaryAggregate<KahanSumState, double, double, KahanSumOperation>(LogicalType::DOUBLE,
	                                                                                           LogicalType::DOUBLE);
}